

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O2

void __thiscall
QNetworkAccessAuthenticationManager::cacheProxyCredentials
          (QNetworkAccessAuthenticationManager *this,QNetworkProxy *p,QAuthenticator *authenticator)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QNetworkAuthenticationCache *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QNetworkProxy proxy;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &this->mutex;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_48._0_8_);
  local_48[8] = true;
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAuthenticator::realm((QString *)&local_68,authenticator);
  proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::QNetworkProxy(&proxy,p);
  QAuthenticator::user((QString *)&local_88,authenticator);
  QNetworkProxy::setUser(&proxy,(QString *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QAuthenticator::password((QString *)&local_88,authenticator);
  pcVar1 = local_88.ptr;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (pcVar1 != (char16_t *)0x0) {
    while( true ) {
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      proxyAuthenticationKey((QByteArray *)&local_88,&proxy,(QString *)&local_68);
      if ((undefined1 *)local_88.size == (undefined1 *)0x0) break;
      this_00 = (QNetworkAuthenticationCache *)operator_new(0x48);
      QNetworkAuthenticationCache::QNetworkAuthenticationCache(this_00);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      QAuthenticator::user((QString *)&local_c0,authenticator);
      QAuthenticator::password((QString *)&local_d8,authenticator);
      QNetworkAuthenticationCache::insert
                (this_00,(QString *)&local_a8,(QString *)&local_c0,(QString *)&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QNetworkAccessCache::addEntry
                ((QNetworkAccessCache *)this,(QByteArray *)&local_88,(CacheableObject *)this_00,-1);
      if ((undefined1 *)local_68.size == (undefined1 *)0x0) {
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
        QNetworkProxy::user((QString *)&local_88,&proxy);
        qVar2 = local_88.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        if ((undefined1 *)qVar2 == (undefined1 *)0x0) goto LAB_0016f227;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QNetworkProxy::setUser(&proxy,(QString *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      }
      else {
        QString::clear((QString *)&local_68);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_88);
  }
LAB_0016f227:
  QNetworkProxy::~QNetworkProxy(&proxy);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessAuthenticationManager::cacheProxyCredentials(const QNetworkProxy &p,
                                                  const QAuthenticator *authenticator)
{
    Q_ASSERT(authenticator);
    Q_ASSERT(p.type() != QNetworkProxy::DefaultProxy);
    Q_ASSERT(p.type() != QNetworkProxy::NoProxy);

    QMutexLocker mutexLocker(&mutex);

    QString realm = authenticator->realm();
    QNetworkProxy proxy = p;
    proxy.setUser(authenticator->user());

    // don't cache null passwords, empty password may be valid though
    if (authenticator->password().isNull())
        return;

    // Set two credentials: one with the username and one without
    do {
        // Set two credentials actually: one with and one without the realm
        do {
            QByteArray cacheKey = proxyAuthenticationKey(proxy, realm);
            if (cacheKey.isEmpty())
                return;             // should not happen

            QNetworkAuthenticationCache *auth = new QNetworkAuthenticationCache;
            auth->insert(QString(), authenticator->user(), authenticator->password());
            authenticationCache.addEntry(cacheKey, auth); // replace the existing one, if there's any

            if (realm.isEmpty()) {
                break;
            } else {
                realm.clear();
            }
        } while (true);

        if (proxy.user().isEmpty())
            break;
        else
            proxy.setUser(QString());
    } while (true);
}